

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmiter.cpp
# Opt level: O0

int __thiscall
CVmObjIterIdx::getp_get_cur_val(CVmObjIterIdx *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_val_t *pvVar2;
  long lVar3;
  long in_RCX;
  CVmObjIterIdx *in_RDX;
  vm_val_t *in_RDI;
  long idx;
  CVmNativeCodeDesc *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  vm_val_t *retval_00;
  
  if ((getp_get_cur_val(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_cur_val(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_cur_val::desc,0);
    __cxa_guard_release(&getp_get_cur_val(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_RDI,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8)
  ;
  if (iVar1 == 0) {
    pvVar2 = (vm_val_t *)get_cur_index((CVmObjIterIdx *)0x3125d2);
    if (((long)pvVar2 < 1) ||
       (retval_00 = pvVar2, lVar3 = get_last_valid((CVmObjIterIdx *)0x3125f3), lVar3 < (long)pvVar2)
       ) {
      err_throw(0);
    }
    get_indexed_val(in_RDX,in_RCX,retval_00);
  }
  return 1;
}

Assistant:

int CVmObjIterIdx::getp_get_cur_val(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                    uint *argc)
{
    long idx;
    static CVmNativeCodeDesc desc(0);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the current index */
    idx = get_cur_index();

    /* if the current value is out of range, throw an error */
    if (idx < 1 || idx > get_last_valid())
        err_throw(VMERR_OUT_OF_RANGE);

    /* retrieve the value for this index */
    get_indexed_val(vmg_ idx, retval);

    /* handled */
    return TRUE;
}